

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_double_retransmit_timeout(mbedtls_ssl_context *ssl)

{
  uint local_1c;
  uint32_t new_timeout;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->handshake->retransmit_timeout < ssl->conf->hs_timeout_max) {
    local_1c = ssl->handshake->retransmit_timeout << 1;
    if ((local_1c < ssl->handshake->retransmit_timeout) || (ssl->conf->hs_timeout_max < local_1c)) {
      local_1c = ssl->conf->hs_timeout_max;
    }
    ssl->handshake->retransmit_timeout = local_1c;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x7e,"update timeout value to %d millisecs",
               (ulong)ssl->handshake->retransmit_timeout);
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_double_retransmit_timeout( mbedtls_ssl_context *ssl )
{
    uint32_t new_timeout;

    if( ssl->handshake->retransmit_timeout >= ssl->conf->hs_timeout_max )
        return( -1 );

    new_timeout = 2 * ssl->handshake->retransmit_timeout;

    /* Avoid arithmetic overflow and range overflow */
    if( new_timeout < ssl->handshake->retransmit_timeout ||
        new_timeout > ssl->conf->hs_timeout_max )
    {
        new_timeout = ssl->conf->hs_timeout_max;
    }

    ssl->handshake->retransmit_timeout = new_timeout;
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "update timeout value to %d millisecs",
                        ssl->handshake->retransmit_timeout ) );

    return( 0 );
}